

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.c
# Opt level: O0

sexp_conflict
sexp_set_signal_action_x_stub
          (sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict arg2,sexp_conflict arg3)

{
  sexp_conflict psVar1;
  sexp_conflict unaff_retaddr;
  sexp_conflict res;
  
  psVar1 = sexp_set_signal_action(arg2,arg3,res,unaff_retaddr);
  return psVar1;
}

Assistant:

sexp sexp_set_signal_action_x_stub (sexp ctx, sexp self, sexp_sint_t n, sexp arg2, sexp arg3) {
  sexp res;
  res = sexp_set_signal_action(ctx, self, arg2, arg3);
  return res;
}